

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_csv.cpp
# Opt level: O2

bool RunVariableBuffer(string *path,idx_t buffer_size,bool set_temp_dir,
                      ColumnDataCollection *ground_truth,string *add_parameters)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  string *psVar4;
  ColumnDataCollection *pCVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_158;
  string error_message;
  long *local_130;
  long *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Connection multi_conn;
  DuckDB db;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  duckdb::DuckDB::DuckDB(&db,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(&multi_conn,&db);
  if (set_temp_dir) {
    std::__cxx11::string::string
              ((string *)&error_message,"PRAGMA temp_directory=\'offload.tmp\'",
               (allocator *)&local_120);
    duckdb::Connection::Query((string *)&local_128);
    if (local_128 != (long *)0x0) {
      (**(code **)(*local_128 + 8))();
    }
    local_128 = (long *)0x0;
    std::__cxx11::string::~string((string *)&error_message);
  }
  std::__cxx11::string::string
            ((string *)&error_message,"SET preserve_insertion_order=false;",(allocator *)&local_120)
  ;
  duckdb::Connection::Query((string *)&local_130);
  if (local_130 != (long *)0x0) {
    (**(code **)(*local_130 + 8))();
  }
  local_130 = (long *)0x0;
  std::__cxx11::string::~string((string *)&error_message);
  std::operator+(&local_b0,"SELECT * FROM read_csv_auto(\'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
  std::operator+(&local_90,&local_b0,"\'");
  std::operator+(&local_70,&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)add_parameters
                );
  std::operator+(&local_50,&local_70,", buffer_size = ");
  std::__cxx11::to_string(&local_d0,buffer_size);
  std::operator+(&local_120,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_message
                 ,&local_120,") ORDER BY ALL");
  duckdb::Connection::Query((string *)&local_158);
  std::__cxx11::string::~string((string *)&error_message);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)&local_158);
  bVar1 = duckdb::BaseQueryResult::HasError();
  if (bVar1 == 0) {
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_158);
    pCVar5 = (ColumnDataCollection *)duckdb::MaterializedQueryResult::Collection();
    if (ground_truth != (ColumnDataCollection *)0x0) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      error_message._M_string_length = 0;
      error_message.field_2._M_local_buf[0] = '\0';
      cVar2 = duckdb::ColumnDataCollection::ResultEquals
                        (ground_truth,pCVar5,(string *)&error_message,false);
      if (cVar2 == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cout,"truth: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"resul: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)path);
        poVar3 = std::operator<<(poVar3," Buffer Size: ");
        std::__cxx11::to_string((string *)&local_120,buffer_size);
        poVar3 = std::operator<<(poVar3,(string *)&local_120);
        std::operator<<(poVar3,'\n');
        std::__cxx11::string::~string((string *)&local_120);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&error_message);
        std::operator<<(poVar3,'\n');
      }
      std::__cxx11::string::~string((string *)&error_message);
      goto LAB_003a1d6e;
    }
LAB_003a1d43:
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)path);
    poVar3 = std::operator<<(poVar3," Failed on max buffer but succeeded on variable buffer reading"
                            );
  }
  else {
    cVar2 = '\x01';
    if ((ground_truth == (ColumnDataCollection *)0x0 & bVar1) != 0) goto LAB_003a1d6e;
    if (ground_truth == (ColumnDataCollection *)0x0) goto LAB_003a1d43;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)path);
    poVar3 = std::operator<<(poVar3," Variable Buffer failed");
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)path);
    poVar3 = std::operator<<(poVar3," Buffer Size: ");
    std::__cxx11::to_string(&error_message,buffer_size);
    poVar3 = std::operator<<(poVar3,(string *)&error_message);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&error_message);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_158);
    psVar4 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&std::cout,psVar4);
  }
  std::operator<<(poVar3,'\n');
  cVar2 = '\0';
LAB_003a1d6e:
  if (local_158._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_158._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(&multi_conn);
  duckdb::DuckDB::~DuckDB(&db);
  return (bool)cVar2;
}

Assistant:

bool RunVariableBuffer(const string &path, idx_t buffer_size, bool set_temp_dir,
                       ColumnDataCollection *ground_truth = nullptr, const string &add_parameters = "") {
	DuckDB db(nullptr);
	Connection multi_conn(db);
	if (set_temp_dir) {
		multi_conn.Query("PRAGMA temp_directory='offload.tmp'");
	}
	multi_conn.Query("SET preserve_insertion_order=false;");
	duckdb::unique_ptr<MaterializedQueryResult> variable_buffer_size_result =
	    multi_conn.Query("SELECT * FROM read_csv_auto('" + path + "'" + add_parameters +
	                     ", buffer_size = " + to_string(buffer_size) + ") ORDER BY ALL");
	bool variable_buffer_size_passed;
	ColumnDataCollection *result = nullptr;
	if (variable_buffer_size_result->HasError()) {
		variable_buffer_size_passed = false;
	} else {
		variable_buffer_size_passed = true;
		result = &variable_buffer_size_result->Collection();
	}
	if (!ground_truth && !variable_buffer_size_passed) {
		// Two wrongs can make a right
		return true;
	}
	if (!ground_truth) {
		//! oh oh, this should not pass
		std::cout << path << " Failed on max buffer but succeeded on variable buffer reading" << '\n';
		return false;
	}
	if (!variable_buffer_size_passed) {
		std::cout << path << " Variable Buffer failed" << '\n';
		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << variable_buffer_size_result->GetError() << '\n';
		return false;
	}
	// Results do not match
	string error_message;
	if (!ColumnDataCollection::ResultEquals(*ground_truth, *result, error_message, false)) {
		std::cout << "truth: " << ground_truth->Count() << std::endl;
		std::cout << "resul: " << result->Count() << std::endl;

		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << error_message << '\n';
		return false;
	}
	return true;
}